

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O3

void Dch_CheckChoices(Aig_Man_t *p,int fSkipRedSupps)

{
  Aig_Obj_t *pAVar1;
  bool bVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  ulong uVar5;
  char *__s;
  Aig_Obj_t *pObj;
  ulong uVar6;
  
  Aig_ManCleanMarkA(p);
  pVVar4 = p->vObjs;
  if (pVVar4->nSize < 1) {
    Aig_ManCleanMarkA(p);
    __s = "Verification of choice AIG succeeded.";
  }
  else {
    uVar6 = 0;
    bVar2 = false;
    do {
      pObj = (Aig_Obj_t *)pVVar4->pArray[uVar6];
      if ((pObj != (Aig_Obj_t *)0x0) &&
         (uVar5 = *(ulong *)&pObj->field_0x18, 0xfffffffd < ((uint)uVar5 & 7) - 7)) {
        if (p->pEquivs[uVar6] != (Aig_Obj_t *)0x0) {
          if ((uVar5 & 0x10) != 0) {
            printf("node %d participates in more than one choice class\n",uVar6 & 0xffffffff);
            uVar5 = *(ulong *)&pObj->field_0x18;
            bVar2 = true;
          }
          *(ulong *)&pObj->field_0x18 = uVar5 | 0x10;
          if ((fSkipRedSupps != 0) &&
             (iVar3 = Dch_ObjCheckSuppRed(p,pObj,p->pEquivs[uVar6]), iVar3 != 0)) {
            printf("node %d and repr %d have diff supports\n",(ulong)(uint)pObj->Id,
                   (ulong)(uint)p->pEquivs[uVar6]->Id);
          }
          pObj = p->pEquivs[uVar6];
          uVar5 = *(ulong *)&pObj->field_0x18;
          if (p->pEquivs[pObj->Id] == (Aig_Obj_t *)0x0) {
            if ((uVar5 & 0x10) != 0) {
              printf("repr %d has final node %d participates in more than one choice class\n",
                     uVar6 & 0xffffffff,(ulong)(uint)pObj->Id);
              uVar5 = *(ulong *)&pObj->field_0x18;
              bVar2 = true;
            }
            uVar5 = uVar5 | 0x10;
            *(ulong *)&pObj->field_0x18 = uVar5;
          }
          if (0x3f < (uint)uVar5) {
            printf("node %d belonging to choice has fanout %d\n",(ulong)(uint)pObj->Id,
                   (ulong)((uint)uVar5 >> 6));
          }
        }
        if (((p->pReprs != (Aig_Obj_t **)0x0) &&
            (pAVar1 = p->pReprs[uVar6], pAVar1 != (Aig_Obj_t *)0x0)) &&
           (0x3f < *(uint *)&pObj->field_0x18)) {
          printf("node %d has representative %d and fanout count %d\n",(ulong)(uint)pObj->Id,
                 (ulong)(uint)pAVar1->Id,(ulong)(*(uint *)&pObj->field_0x18 >> 6));
          bVar2 = true;
        }
      }
      uVar6 = uVar6 + 1;
      pVVar4 = p->vObjs;
    } while ((long)uVar6 < (long)pVVar4->nSize);
    Aig_ManCleanMarkA(p);
    __s = "Verification of choice AIG FAILED.";
    if (!bVar2) {
      __s = "Verification of choice AIG succeeded.";
    }
  }
  puts(__s);
  return;
}

Assistant:

void Dch_CheckChoices( Aig_Man_t * p, int fSkipRedSupps )
{
    Aig_Obj_t * pObj;
    int i, fProb = 0;
    Aig_ManCleanMarkA( p );
    Aig_ManForEachNode( p, pObj, i )
    {
        if ( p->pEquivs[i] != NULL )
        {
            if ( pObj->fMarkA == 1 )
                printf( "node %d participates in more than one choice class\n", i ), fProb = 1;
            pObj->fMarkA = 1;
            // check redundancy
            if ( fSkipRedSupps && Dch_ObjCheckSuppRed( p, pObj, p->pEquivs[i]) )
                printf( "node %d and repr %d have diff supports\n", pObj->Id, p->pEquivs[i]->Id );
            // consider the next one
            pObj = p->pEquivs[i];
            if ( p->pEquivs[Aig_ObjId(pObj)] == NULL )
            {
                if ( pObj->fMarkA == 1 )
                    printf( "repr %d has final node %d participates in more than one choice class\n", i, pObj->Id ), fProb = 1;
                pObj->fMarkA = 1;
            }
            // consider the non-head ones
            if ( pObj->nRefs > 0 )
                printf( "node %d belonging to choice has fanout %d\n", pObj->Id, pObj->nRefs );
        }
        if ( p->pReprs && p->pReprs[i] != NULL )
        {
            if ( pObj->nRefs > 0 )
                printf( "node %d has representative %d and fanout count %d\n", pObj->Id, p->pReprs[i]->Id, pObj->nRefs ), fProb = 1;
        }
    }
    Aig_ManCleanMarkA( p );
    if ( !fProb )
        printf( "Verification of choice AIG succeeded.\n" );
    else
        printf( "Verification of choice AIG FAILED.\n" );
}